

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_handshake_init(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_transform *pmVar1;
  mbedtls_ssl_session *pmVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->transform_negotiate != (mbedtls_ssl_transform *)0x0) {
    mbedtls_ssl_transform_free(ssl->transform_negotiate);
  }
  if (ssl->session_negotiate != (mbedtls_ssl_session *)0x0) {
    mbedtls_ssl_session_free(ssl->session_negotiate);
  }
  if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
    mbedtls_ssl_handshake_free(ssl->handshake);
  }
  if (ssl->transform_negotiate == (mbedtls_ssl_transform *)0x0) {
    pmVar1 = (mbedtls_ssl_transform *)calloc(1,0x158);
    ssl->transform_negotiate = pmVar1;
  }
  if (ssl->session_negotiate == (mbedtls_ssl_session *)0x0) {
    pmVar2 = (mbedtls_ssl_session *)calloc(1,0x98);
    ssl->session_negotiate = pmVar2;
  }
  if (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) {
    pmVar3 = (mbedtls_ssl_handshake_params *)calloc(1,0xaa0);
    ssl->handshake = pmVar3;
  }
  if (((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
      (ssl->transform_negotiate == (mbedtls_ssl_transform *)0x0)) ||
     (ssl->session_negotiate == (mbedtls_ssl_session *)0x0)) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x1455,"alloc() of ssl sub-contexts failed");
    free(ssl->handshake);
    free(ssl->transform_negotiate);
    free(ssl->session_negotiate);
    ssl->handshake = (mbedtls_ssl_handshake_params *)0x0;
    ssl->transform_negotiate = (mbedtls_ssl_transform *)0x0;
    ssl->session_negotiate = (mbedtls_ssl_session *)0x0;
    ssl_local._4_4_ = -0x7f00;
  }
  else {
    mbedtls_ssl_session_init(ssl->session_negotiate);
    ssl_transform_init(ssl->transform_negotiate);
    ssl_handshake_params_init(ssl->handshake);
    if ((*(uint *)&ssl->conf->field_0x164 >> 1 & 1) == 1) {
      ssl->handshake->alt_transform_out = ssl->transform_out;
      if ((*(uint *)&ssl->conf->field_0x164 & 1) == 0) {
        ssl->handshake->retransmit_state = '\0';
      }
      else {
        ssl->handshake->retransmit_state = '\x02';
      }
      ssl_set_timer(ssl,0);
    }
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_handshake_init( mbedtls_ssl_context *ssl )
{
    /* Clear old handshake information if present */
    if( ssl->transform_negotiate )
        mbedtls_ssl_transform_free( ssl->transform_negotiate );
    if( ssl->session_negotiate )
        mbedtls_ssl_session_free( ssl->session_negotiate );
    if( ssl->handshake )
        mbedtls_ssl_handshake_free( ssl->handshake );

    /*
     * Either the pointers are now NULL or cleared properly and can be freed.
     * Now allocate missing structures.
     */
    if( ssl->transform_negotiate == NULL )
    {
        ssl->transform_negotiate = mbedtls_calloc( 1, sizeof(mbedtls_ssl_transform) );
    }

    if( ssl->session_negotiate == NULL )
    {
        ssl->session_negotiate = mbedtls_calloc( 1, sizeof(mbedtls_ssl_session) );
    }

    if( ssl->handshake == NULL )
    {
        ssl->handshake = mbedtls_calloc( 1, sizeof(mbedtls_ssl_handshake_params) );
    }

    /* All pointers should exist and can be directly freed without issue */
    if( ssl->handshake == NULL ||
        ssl->transform_negotiate == NULL ||
        ssl->session_negotiate == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc() of ssl sub-contexts failed" ) );

        mbedtls_free( ssl->handshake );
        mbedtls_free( ssl->transform_negotiate );
        mbedtls_free( ssl->session_negotiate );

        ssl->handshake = NULL;
        ssl->transform_negotiate = NULL;
        ssl->session_negotiate = NULL;

        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
    }

    /* Initialize structures */
    mbedtls_ssl_session_init( ssl->session_negotiate );
    ssl_transform_init( ssl->transform_negotiate );
    ssl_handshake_params_init( ssl->handshake );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        ssl->handshake->alt_transform_out = ssl->transform_out;

        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
            ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_PREPARING;
        else
            ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_WAITING;

        ssl_set_timer( ssl, 0 );
    }
#endif

    return( 0 );
}